

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

int cmcmd_cmake_ninja_depends(const_iterator argBeg,const_iterator argEnd)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  ostream *poVar4;
  pointer pcVar5;
  Value *pVVar6;
  reference pbVar7;
  size_type sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  undefined1 local_898 [8];
  cmGeneratedFileStream ddif;
  string *r;
  iterator __end1_3;
  iterator __begin1_3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_3;
  Value *local_5e0;
  Value *ddi_requires;
  reference local_5b0;
  string *provide;
  iterator __end1_2;
  iterator __begin1_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  Value *local_568;
  Value *ddi_provides;
  undefined1 local_538 [8];
  Value ddi;
  string *include;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  undefined1 local_4b0 [8];
  cmGeneratedFileStream depfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_> local_220;
  unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_> info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  string *arg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin1;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_f8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_e8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  string arg_lang;
  string arg_ddi;
  string arg_obj;
  string arg_dep;
  string arg_pp;
  string arg_tdi;
  const_iterator argEnd_local;
  const_iterator argBeg_local;
  
  std::__cxx11::string::string((string *)(arg_pp.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(arg_dep.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(arg_obj.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(arg_ddi.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(arg_lang.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&__range1);
  local_f8 = cmMakeRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )argBeg._M_current,
                        (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )argEnd._M_current);
  local_e8 = &local_f8;
  __end1 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::begin(local_e8);
  arg = (string *)
        cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::end(local_e8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arg);
    if (!bVar1) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            uVar3 = std::__cxx11::string::empty();
            if ((uVar3 & 1) == 0) {
              uVar3 = std::__cxx11::string::empty();
              if ((uVar3 & 1) == 0) {
                uVar3 = std::__cxx11::string::empty();
                if ((uVar3 & 1) == 0) {
                  std::unique_ptr<cmSourceInfo,std::default_delete<cmSourceInfo>>::
                  unique_ptr<std::default_delete<cmSourceInfo>,void>
                            ((unique_ptr<cmSourceInfo,std::default_delete<cmSourceInfo>> *)
                             &local_220);
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&__range1,"Fortran");
                  if (bVar1) {
                    cmcmd_cmake_ninja_depends_fortran
                              ((string *)local_228,(string *)((long)&arg_pp.field_2 + 8));
                    std::unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_>::operator=
                              (&local_220,
                               (unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_> *)
                               local_228);
                    std::unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_>::~unique_ptr
                              ((unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_> *)
                               local_228);
                    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_220);
                    if (bVar1) {
                      cmGeneratedFileStream::cmGeneratedFileStream
                                ((cmGeneratedFileStream *)local_4b0,
                                 (string *)((long)&arg_obj.field_2 + 8),false,None);
                      cmsys::SystemTools::ConvertToUnixOutputPath
                                ((string *)&__range1_1,(string *)((long)&arg_dep.field_2 + 8));
                      poVar4 = std::operator<<((ostream *)local_4b0,(string *)&__range1_1);
                      std::operator<<(poVar4,":");
                      std::__cxx11::string::~string((string *)&__range1_1);
                      pcVar5 = std::unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_>::
                               operator->(&local_220);
                      __end1_1 = std::
                                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::begin(&pcVar5->Includes);
                      include = (string *)
                                std::
                                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::end(&pcVar5->Includes);
                      while( true ) {
                        bVar1 = std::operator!=(&__end1_1,(_Self *)&include);
                        if (!bVar1) break;
                        pbVar7 = std::
                                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::operator*(&__end1_1);
                        poVar4 = std::operator<<((ostream *)local_4b0," \\\n ");
                        cmsys::SystemTools::ConvertToUnixOutputPath((string *)&ddi.limit_,pbVar7);
                        std::operator<<(poVar4,(string *)&ddi.limit_);
                        std::__cxx11::string::~string((string *)&ddi.limit_);
                        std::
                        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator++(&__end1_1);
                      }
                      std::operator<<((ostream *)local_4b0,"\n");
                      cmGeneratedFileStream::~cmGeneratedFileStream
                                ((cmGeneratedFileStream *)local_4b0);
                      Json::Value::Value((Value *)local_538,objectValue);
                      Json::Value::Value((Value *)&ddi_provides,
                                         (string *)((long)&arg_ddi.field_2 + 8));
                      pVVar6 = Json::Value::operator[]((Value *)local_538,"object");
                      Json::Value::operator=(pVVar6,(Value *)&ddi_provides);
                      Json::Value::~Value((Value *)&ddi_provides);
                      Json::Value::Value((Value *)&__range1_2,arrayValue);
                      pVVar6 = Json::Value::operator[]((Value *)local_538,"provides");
                      pVVar6 = Json::Value::operator=(pVVar6,(Value *)&__range1_2);
                      Json::Value::~Value((Value *)&__range1_2);
                      local_568 = pVVar6;
                      pcVar5 = std::unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_>::
                               operator->(&local_220);
                      __end1_2 = std::
                                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::begin(&pcVar5->Provides);
                      provide = (string *)
                                std::
                                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::end(&pcVar5->Provides);
                      while( true ) {
                        bVar1 = std::operator!=(&__end1_2,(_Self *)&provide);
                        if (!bVar1) break;
                        local_5b0 = std::
                                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator*(&__end1_2);
                        pVVar6 = local_568;
                        Json::Value::Value((Value *)&ddi_requires,local_5b0);
                        Json::Value::append(pVVar6,(Value *)&ddi_requires);
                        Json::Value::~Value((Value *)&ddi_requires);
                        std::
                        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator++(&__end1_2);
                      }
                      Json::Value::Value((Value *)&__range1_3,arrayValue);
                      pVVar6 = Json::Value::operator[]((Value *)local_538,"requires");
                      pVVar6 = Json::Value::operator=(pVVar6,(Value *)&__range1_3);
                      Json::Value::~Value((Value *)&__range1_3);
                      local_5e0 = pVVar6;
                      pcVar5 = std::unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_>::
                               operator->(&local_220);
                      __end1_3 = std::
                                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::begin(&pcVar5->Requires);
                      r = (string *)
                          std::
                          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end(&pcVar5->Requires);
                      while( true ) {
                        bVar1 = std::operator!=(&__end1_3,(_Self *)&r);
                        if (!bVar1) break;
                        pbVar7 = std::
                                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::operator*(&__end1_3);
                        pcVar5 = std::unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_>::
                                 operator->(&local_220);
                        sVar8 = std::
                                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::count(&pcVar5->Provides,pbVar7);
                        pVVar6 = local_5e0;
                        if (sVar8 == 0) {
                          Json::Value::Value((Value *)&ddif.field_0x240,pbVar7);
                          Json::Value::append(pVVar6,(Value *)&ddif.field_0x240);
                          Json::Value::~Value((Value *)&ddif.field_0x240);
                        }
                        std::
                        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator++(&__end1_3);
                      }
                      cmGeneratedFileStream::cmGeneratedFileStream
                                ((cmGeneratedFileStream *)local_898,
                                 (string *)((long)&arg_lang.field_2 + 8),false,None);
                      Json::operator<<((ostream *)local_898,(Value *)local_538);
                      bVar2 = std::ios::operator!((ios *)(local_898 +
                                                         (long)*(_func_int **)
                                                                ((long)local_898 + -0x18)));
                      argBeg_local._M_current._4_1_ = (bVar2 & 1) != 0;
                      if (argBeg_local._M_current._4_1_) {
                        std::operator+(&local_8b8,"-E cmake_ninja_depends failed to write ",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&arg_lang.field_2 + 8));
                        cmSystemTools::Error(&local_8b8);
                        std::__cxx11::string::~string((string *)&local_8b8);
                      }
                      argBeg_local._M_current._5_3_ = 0;
                      info._M_t.
                      super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>._M_t.
                      super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
                      super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl._4_4_ = 1;
                      cmGeneratedFileStream::~cmGeneratedFileStream
                                ((cmGeneratedFileStream *)local_898);
                      Json::Value::~Value((Value *)local_538);
                    }
                    else {
                      argBeg_local._M_current._4_4_ = 1;
                      info._M_t.
                      super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>._M_t.
                      super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
                      super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl._4_4_ = 1;
                    }
                  }
                  else {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&depfile.field_0x240,
                                   "-E cmake_ninja_depends does not understand the ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&__range1);
                    std::operator+(&local_248,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&depfile.field_0x240," language");
                    cmSystemTools::Error(&local_248);
                    std::__cxx11::string::~string((string *)&local_248);
                    std::__cxx11::string::~string((string *)&depfile.field_0x240);
                    argBeg_local._M_current._4_4_ = 1;
                    info._M_t.
                    super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>._M_t.
                    super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
                    super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl._4_4_ = 1;
                  }
                  std::unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_>::~unique_ptr
                            (&local_220);
                }
                else {
                  cmSystemTools::Error
                            ("-E cmake_ninja_depends requires value for --lang=",(char *)0x0,
                             (char *)0x0,(char *)0x0);
                  argBeg_local._M_current._4_4_ = 1;
                  info._M_t.super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>.
                  _M_t.super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
                  super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl._4_4_ = 1;
                }
              }
              else {
                cmSystemTools::Error
                          ("-E cmake_ninja_depends requires value for --ddi=",(char *)0x0,
                           (char *)0x0,(char *)0x0);
                argBeg_local._M_current._4_4_ = 1;
                info._M_t.super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>.
                _M_t.super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
                super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl._4_4_ = 1;
              }
            }
            else {
              cmSystemTools::Error
                        ("-E cmake_ninja_depends requires value for --obj=",(char *)0x0,(char *)0x0,
                         (char *)0x0);
              argBeg_local._M_current._4_4_ = 1;
              info._M_t.super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>._M_t
              .super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
              super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl._4_4_ = 1;
            }
          }
          else {
            cmSystemTools::Error
                      ("-E cmake_ninja_depends requires value for --dep=",(char *)0x0,(char *)0x0,
                       (char *)0x0);
            argBeg_local._M_current._4_4_ = 1;
            info._M_t.super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>._M_t.
            super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
            super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl._4_4_ = 1;
          }
        }
        else {
          cmSystemTools::Error
                    ("-E cmake_ninja_depends requires value for --pp=",(char *)0x0,(char *)0x0,
                     (char *)0x0);
          argBeg_local._M_current._4_4_ = 1;
          info._M_t.super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>._M_t.
          super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
          super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl._4_4_ = 1;
        }
      }
      else {
        cmSystemTools::Error
                  ("-E cmake_ninja_depends requires value for --tdi=",(char *)0x0,(char *)0x0,
                   (char *)0x0);
        argBeg_local._M_current._4_4_ = 1;
        info._M_t.super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>._M_t.
        super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
        super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl._4_4_ = 1;
      }
LAB_0032eed8:
      std::__cxx11::string::~string((string *)&__range1);
      std::__cxx11::string::~string((string *)(arg_lang.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(arg_ddi.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(arg_obj.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(arg_dep.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(arg_pp.field_2._M_local_buf + 8));
      return argBeg_local._M_current._4_4_;
    }
    local_130 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,7ul>(local_130,(char (*) [7])0x794517);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)local_150,(ulong)local_130);
      std::__cxx11::string::operator=((string *)(arg_pp.field_2._M_local_buf + 8),local_150);
      std::__cxx11::string::~string(local_150);
    }
    else {
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,6ul>(local_130,(char (*) [6])0x793ba4);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)local_170,(ulong)local_130);
        std::__cxx11::string::operator=((string *)(arg_dep.field_2._M_local_buf + 8),local_170);
        std::__cxx11::string::~string(local_170);
      }
      else {
        bVar1 = cmHasLiteralPrefix<std::__cxx11::string,7ul>(local_130,(char (*) [7])0x793bd4);
        if (bVar1) {
          std::__cxx11::string::substr((ulong)local_190,(ulong)local_130);
          std::__cxx11::string::operator=((string *)(arg_obj.field_2._M_local_buf + 8),local_190);
          std::__cxx11::string::~string(local_190);
        }
        else {
          bVar1 = cmHasLiteralPrefix<std::__cxx11::string,7ul>(local_130,(char (*) [7])0x793c05);
          if (bVar1) {
            std::__cxx11::string::substr((ulong)local_1b0,(ulong)local_130);
            std::__cxx11::string::operator=((string *)(arg_ddi.field_2._M_local_buf + 8),local_1b0);
            std::__cxx11::string::~string(local_1b0);
          }
          else {
            bVar1 = cmHasLiteralPrefix<std::__cxx11::string,7ul>(local_130,(char (*) [7])0x793c36);
            if (bVar1) {
              std::__cxx11::string::substr((ulong)local_1d0,(ulong)local_130);
              std::__cxx11::string::operator=
                        ((string *)(arg_lang.field_2._M_local_buf + 8),local_1d0);
              std::__cxx11::string::~string(local_1d0);
            }
            else {
              bVar1 = cmHasLiteralPrefix<std::__cxx11::string,8ul>(local_130,(char (*) [8])0x793dbd)
              ;
              if (!bVar1) {
                std::operator+(&local_210,"-E cmake_ninja_depends unknown argument: ",local_130);
                cmSystemTools::Error(&local_210);
                std::__cxx11::string::~string((string *)&local_210);
                argBeg_local._M_current._4_4_ = 1;
                info._M_t.super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>.
                _M_t.super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
                super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl._4_4_ = 1;
                goto LAB_0032eed8;
              }
              std::__cxx11::string::substr((ulong)local_1f0,(ulong)local_130);
              std::__cxx11::string::operator=((string *)&__range1,local_1f0);
              std::__cxx11::string::~string(local_1f0);
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

int cmcmd_cmake_ninja_depends(std::vector<std::string>::const_iterator argBeg,
                              std::vector<std::string>::const_iterator argEnd)
{
  std::string arg_tdi;
  std::string arg_pp;
  std::string arg_dep;
  std::string arg_obj;
  std::string arg_ddi;
  std::string arg_lang;
  for (std::string const& arg : cmMakeRange(argBeg, argEnd)) {
    if (cmHasLiteralPrefix(arg, "--tdi=")) {
      arg_tdi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--pp=")) {
      arg_pp = arg.substr(5);
    } else if (cmHasLiteralPrefix(arg, "--dep=")) {
      arg_dep = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--obj=")) {
      arg_obj = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--ddi=")) {
      arg_ddi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--lang=")) {
      arg_lang = arg.substr(7);
    } else {
      cmSystemTools::Error("-E cmake_ninja_depends unknown argument: " + arg);
      return 1;
    }
  }
  if (arg_tdi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --tdi=");
    return 1;
  }
  if (arg_pp.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --pp=");
    return 1;
  }
  if (arg_dep.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --dep=");
    return 1;
  }
  if (arg_obj.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --obj=");
    return 1;
  }
  if (arg_ddi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --ddi=");
    return 1;
  }
  if (arg_lang.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --lang=");
    return 1;
  }

  std::unique_ptr<cmSourceInfo> info;
  if (arg_lang == "Fortran") {
    info = cmcmd_cmake_ninja_depends_fortran(arg_tdi, arg_pp);
  } else {
    cmSystemTools::Error("-E cmake_ninja_depends does not understand the " +
                         arg_lang + " language");
    return 1;
  }

  if (!info) {
    // The error message is already expected to have been output.
    return 1;
  }

  {
    cmGeneratedFileStream depfile(arg_dep);
    depfile << cmSystemTools::ConvertToUnixOutputPath(arg_pp) << ":";
    for (std::string const& include : info->Includes) {
      depfile << " \\\n " << cmSystemTools::ConvertToUnixOutputPath(include);
    }
    depfile << "\n";
  }

  Json::Value ddi(Json::objectValue);
  ddi["object"] = arg_obj;

  Json::Value& ddi_provides = ddi["provides"] = Json::arrayValue;
  for (std::string const& provide : info->Provides) {
    ddi_provides.append(provide);
  }
  Json::Value& ddi_requires = ddi["requires"] = Json::arrayValue;
  for (std::string const& r : info->Requires) {
    // Require modules not provided in the same source.
    if (!info->Provides.count(r)) {
      ddi_requires.append(r);
    }
  }

  cmGeneratedFileStream ddif(arg_ddi);
  ddif << ddi;
  if (!ddif) {
    cmSystemTools::Error("-E cmake_ninja_depends failed to write " + arg_ddi);
    return 1;
  }
  return 0;
}